

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createDeviceWithUnsupportedExtensionsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Functions *this;
  PlatformInterface *vkPlatform;
  TestLog *pTVar1;
  TestStatus *__return_storage_ptr___00;
  VkResult VVar2;
  VkPhysicalDevice physicalDevice;
  MessageBuilder *this_00;
  TestError *this_01;
  long lVar3;
  allocator<char> local_731;
  VkDevice device;
  RefBase<vk::VkInstance_s_*> local_728;
  TestStatus *local_708;
  float queuePriority;
  char *enabledExtensions [3];
  VkDeviceCreateInfo deviceCreateInfo;
  VkDeviceQueueCreateInfo local_698;
  InstanceDriver instanceDriver;
  DeviceDriver deviceIface;
  
  vkPlatform = context->m_platformInterface;
  pTVar1 = context->m_testCtx->m_log;
  ::vk::createDefaultInstance((Move<vk::VkInstance_s_*> *)&deviceIface,vkPlatform);
  local_728.m_data.deleter.m_allocator = (VkAllocationCallbacks *)deviceIface.m_vk.getDeviceQueue;
  local_728.m_data.object = (VkInstance_s *)deviceIface.super_DeviceInterface._vptr_DeviceInterface;
  local_728.m_data.deleter.m_destroyInstance = (DestroyInstanceFunc)deviceIface.m_vk.destroyDevice;
  deviceIface.super_DeviceInterface._vptr_DeviceInterface = (_func_int **)0x0;
  deviceIface.m_vk.destroyDevice = (DestroyDeviceFunc)0x0;
  deviceIface.m_vk.getDeviceQueue = (GetDeviceQueueFunc)0x0;
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase
            ((RefBase<vk::VkInstance_s_*> *)&deviceIface);
  ::vk::InstanceDriver::InstanceDriver(&instanceDriver,vkPlatform,local_728.m_data.object);
  enabledExtensions[2] = "VK_DONT_SUPPORT_ME";
  enabledExtensions[0] = "VK_UNSUPPORTED_EXTENSION";
  enabledExtensions[1] = "THIS_IS_NOT_AN_EXTENSION";
  physicalDevice =
       ::vk::chooseDevice(&instanceDriver.super_InstanceInterface,local_728.m_data.object,
                          context->m_testCtx->m_cmdLine);
  local_698.pQueuePriorities = &queuePriority;
  deviceCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
  deviceCreateInfo.pNext = (void *)0x0;
  queuePriority = 1.0;
  deviceCreateInfo.flags = 0;
  deviceCreateInfo.queueCreateInfoCount = 1;
  deviceCreateInfo.pQueueCreateInfos = &local_698;
  deviceCreateInfo.enabledLayerCount = 0;
  local_698.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  deviceCreateInfo.ppEnabledLayerNames = (char **)0x0;
  local_698.pNext = (void *)0x0;
  local_698.flags = 0;
  local_698.queueFamilyIndex = 0;
  deviceCreateInfo.ppEnabledExtensionNames = enabledExtensions;
  deviceCreateInfo.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
  local_698.queueCount = 1;
  this = &deviceIface.m_vk;
  deviceCreateInfo.enabledExtensionCount = deviceCreateInfo.sType;
  deviceIface.super_DeviceInterface._vptr_DeviceInterface = (_func_int **)pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  local_708 = __return_storage_ptr__;
  std::operator<<((ostream *)this,"Enabled extensions are: ");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&deviceIface,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
    deviceIface.super_DeviceInterface._vptr_DeviceInterface = (_func_int **)pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&deviceIface.m_vk);
    this_00 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&deviceIface,(char **)((long)enabledExtensions + lVar3));
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&deviceIface.m_vk);
  }
  device = (VkDevice)0x0;
  VVar2 = ::vk::InstanceDriver::createDevice
                    (&instanceDriver,physicalDevice,&deviceCreateInfo,(VkAllocationCallbacks *)0x0,
                     &device);
  __return_storage_ptr___00 = local_708;
  if (device == (VkDevice)0x0) {
    if (VVar2 == VK_ERROR_EXTENSION_NOT_PRESENT) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&deviceIface,
                 "Pass, create device with unsupported extension is rejected.",&local_731);
      tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&deviceIface);
      goto LAB_0046143d;
    }
  }
  else {
    ::vk::DeviceDriver::DeviceDriver(&deviceIface,&instanceDriver.super_InstanceInterface,device);
    ::vk::DeviceDriver::destroyDevice(&deviceIface,device,(VkAllocationCallbacks *)0x0);
    ::vk::DeviceDriver::~DeviceDriver(&deviceIface);
    if (VVar2 == VK_ERROR_EXTENSION_NOT_PRESENT) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,(char *)0x0,"!gotDevice",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                 ,0x216);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&deviceIface,"Fail, create device with unsupported extension but succeed.",
             &local_731);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&deviceIface);
LAB_0046143d:
  std::__cxx11::string::~string((string *)&deviceIface);
  ::vk::InstanceDriver::~InstanceDriver(&instanceDriver);
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_728);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus createDeviceWithUnsupportedExtensionsTest (Context& context)
{
	tcu::TestLog&					log						= context.getTestContext().getLog();
	const PlatformInterface&		platformInterface		= context.getPlatformInterface();
	const Unique<VkInstance>		instance				(createDefaultInstance(platformInterface));
	const InstanceDriver			instanceDriver			(platformInterface, instance.get());
	const char*						enabledExtensions[]		= {"VK_UNSUPPORTED_EXTENSION", "THIS_IS_NOT_AN_EXTENSION", "VK_DONT_SUPPORT_ME"};
	const VkPhysicalDevice			physicalDevice			= chooseDevice(instanceDriver, instance.get(), context.getTestContext().getCommandLine());
	const float						queuePriority			= 1.0f;
	const VkDeviceQueueCreateInfo	deviceQueueCreateInfo	=
	{
		VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
		DE_NULL,
		(VkDeviceQueueCreateFlags)0u,
		0,										//queueFamilyIndex;
		1,										//queueCount;
		&queuePriority,							//pQueuePriorities;
	};
	const VkDeviceCreateInfo		deviceCreateInfo		=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,	//sType;
		DE_NULL,								//pNext;
		(VkDeviceCreateFlags)0u,
		1,										//queueRecordCount;
		&deviceQueueCreateInfo,					//pRequestedQueues;
		0,										//layerCount;
		DE_NULL,								//ppEnabledLayerNames;
		DE_LENGTH_OF_ARRAY(enabledExtensions),	//extensionCount;
		enabledExtensions,						//ppEnabledExtensionNames;
		DE_NULL,								//pEnabledFeatures;
	};

	log << TestLog::Message << "Enabled extensions are: " << TestLog::EndMessage;

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(enabledExtensions); ndx++)
		log << TestLog::Message << enabledExtensions[ndx] <<  TestLog::EndMessage;

	{
		VkDevice		device		= (VkDevice)0;
		const VkResult	result		= instanceDriver.createDevice(physicalDevice, &deviceCreateInfo, DE_NULL/*pAllocator*/, &device);
		const bool		gotDevice	= !!device;

		if (device)
		{
			const DeviceDriver	deviceIface	(instanceDriver, device);
			deviceIface.destroyDevice(device, DE_NULL/*pAllocator*/);
		}

		if (result == VK_ERROR_EXTENSION_NOT_PRESENT)
		{
			TCU_CHECK(!gotDevice);
			return tcu::TestStatus::pass("Pass, create device with unsupported extension is rejected.");
		}
		else
			return tcu::TestStatus::fail("Fail, create device with unsupported extension but succeed.");
	}
}